

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O1

cupdlp_retcode
getUserParam(int argc,char **argv,cupdlp_bool *ifChangeIntParam,cupdlp_int *intParam,
            cupdlp_bool *ifChangeFloatParam,cupdlp_float *floatParam)

{
  char *__s1;
  int iVar1;
  ulong uVar2;
  double dVar3;
  
  ifChangeIntParam[8] = false;
  ifChangeIntParam[9] = false;
  ifChangeIntParam[10] = false;
  ifChangeIntParam[0xb] = false;
  ifChangeIntParam[0] = false;
  ifChangeIntParam[1] = false;
  ifChangeIntParam[2] = false;
  ifChangeIntParam[3] = false;
  ifChangeIntParam[4] = false;
  ifChangeIntParam[5] = false;
  ifChangeIntParam[6] = false;
  ifChangeIntParam[7] = false;
  ifChangeFloatParam[0] = false;
  ifChangeFloatParam[1] = false;
  ifChangeFloatParam[2] = false;
  ifChangeFloatParam[3] = false;
  ifChangeFloatParam[4] = false;
  ifChangeFloatParam[5] = false;
  if (1 < argc) {
    uVar2 = 0;
    do {
      __s1 = argv[uVar2];
      iVar1 = strcmp(__s1,"-h");
      if (iVar1 == 0) {
        PDHG_PrintUserParamHelper();
        return 1;
      }
      iVar1 = strcmp(__s1,"-nIterLim");
      if (iVar1 == 0) {
        *ifChangeIntParam = true;
        iVar1 = atoi(argv[uVar2 + 1]);
        *intParam = iVar1;
      }
      else {
        iVar1 = strcmp(__s1,"-ifScaling");
        if (iVar1 == 0) {
          ifChangeIntParam[1] = true;
          iVar1 = atoi(argv[uVar2 + 1]);
          intParam[1] = iVar1;
        }
        else {
          iVar1 = strcmp(__s1,"-iScalingMethod");
          if (iVar1 == 0) {
            ifChangeIntParam[2] = true;
            iVar1 = atoi(argv[uVar2 + 1]);
            intParam[2] = iVar1;
          }
          else {
            iVar1 = strcmp(__s1,"-eLineSearchMethod");
            if (iVar1 == 0) {
              ifChangeIntParam[3] = true;
              iVar1 = atoi(argv[uVar2 + 1]);
              intParam[3] = iVar1;
            }
            else {
              iVar1 = strcmp(__s1,"-dScalingLimit");
              if (iVar1 == 0) {
                *ifChangeFloatParam = true;
                dVar3 = atof(argv[uVar2 + 1]);
                *floatParam = dVar3;
              }
              else {
                iVar1 = strcmp(__s1,"-dPrimalTol");
                if (iVar1 == 0) {
                  ifChangeFloatParam[1] = true;
                  dVar3 = atof(argv[uVar2 + 1]);
                  floatParam[1] = dVar3;
                }
                else {
                  iVar1 = strcmp(__s1,"-dDualTol");
                  if (iVar1 == 0) {
                    ifChangeFloatParam[2] = true;
                    dVar3 = atof(argv[uVar2 + 1]);
                    floatParam[2] = dVar3;
                  }
                  else {
                    iVar1 = strcmp(__s1,"-dGapTol");
                    if (iVar1 == 0) {
                      ifChangeFloatParam[3] = true;
                      dVar3 = atof(argv[uVar2 + 1]);
                      floatParam[3] = dVar3;
                    }
                    else {
                      iVar1 = strcmp(__s1,"-dFeasTol");
                      if (iVar1 == 0) {
                        ifChangeFloatParam[4] = true;
                        dVar3 = atof(argv[uVar2 + 1]);
                        floatParam[4] = dVar3;
                      }
                      else {
                        iVar1 = strcmp(__s1,"-dTimeLim");
                        if (iVar1 == 0) {
                          ifChangeFloatParam[5] = true;
                          dVar3 = atof(argv[uVar2 + 1]);
                          floatParam[5] = dVar3;
                        }
                        else {
                          iVar1 = strcmp(__s1,"-eRestartMethod");
                          if (iVar1 == 0) {
                            ifChangeIntParam[4] = true;
                            iVar1 = atoi(argv[uVar2 + 1]);
                            intParam[4] = iVar1;
                          }
                          else {
                            iVar1 = strcmp(__s1,"-ifRuizScaling");
                            if (iVar1 == 0) {
                              ifChangeIntParam[5] = true;
                              iVar1 = atoi(argv[uVar2 + 1]);
                              intParam[5] = iVar1;
                            }
                            else {
                              iVar1 = strcmp(__s1,"-ifL2Scaling");
                              if (iVar1 == 0) {
                                ifChangeIntParam[6] = true;
                                iVar1 = atoi(argv[uVar2 + 1]);
                                intParam[6] = iVar1;
                              }
                              else {
                                iVar1 = strcmp(__s1,"-ifPcScaling");
                                if (iVar1 == 0) {
                                  ifChangeIntParam[7] = true;
                                  iVar1 = atoi(argv[uVar2 + 1]);
                                  intParam[7] = iVar1;
                                }
                                else {
                                  iVar1 = strcmp(__s1,"-nLogLevel");
                                  if (iVar1 == 0) {
                                    ifChangeIntParam[8] = true;
                                    iVar1 = atoi(argv[uVar2 + 1]);
                                    intParam[8] = iVar1;
                                  }
                                  else {
                                    iVar1 = strcmp(__s1,"-nLogInt");
                                    if (iVar1 == 0) {
                                      ifChangeIntParam[9] = true;
                                      iVar1 = atoi(argv[uVar2 + 1]);
                                      intParam[9] = iVar1;
                                    }
                                    else {
                                      iVar1 = strcmp(__s1,"-ifPre");
                                      if (iVar1 == 0) {
                                        ifChangeIntParam[10] = true;
                                        iVar1 = atoi(argv[uVar2 + 1]);
                                        intParam[10] = iVar1;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      uVar2 = uVar2 + 1;
    } while (argc - 1 != uVar2);
  }
  return 0;
}

Assistant:

cupdlp_retcode getUserParam(int argc, char **argv,
                            cupdlp_bool *ifChangeIntParam, cupdlp_int *intParam,
                            cupdlp_bool *ifChangeFloatParam,
                            cupdlp_float *floatParam) {
  cupdlp_retcode retcode = RETCODE_OK;

  // set ifChangeIntParam and ifChangeFloatParam to false
  for (cupdlp_int i = 0; i < N_INT_USER_PARAM; ++i) {
    ifChangeIntParam[i] = false;
  }

  for (cupdlp_int i = 0; i < N_FLOAT_USER_PARAM; ++i) {
    ifChangeFloatParam[i] = false;
  }

  // parse command line arguments
  for (cupdlp_int i = 0; i < argc - 1; ++i) {
    if (strcmp(argv[i], "-h") == 0) {
      PDHG_PrintUserParamHelper();

      retcode = RETCODE_FAILED;
      goto exit_cleanup;
    }

    if (strcmp(argv[i], "-nIterLim") == 0) {
      ifChangeIntParam[N_ITER_LIM] = true;
      intParam[N_ITER_LIM] = atoi(argv[i + 1]);
    } else if (strcmp(argv[i], "-ifScaling") == 0) {
      ifChangeIntParam[IF_SCALING] = true;
      intParam[IF_SCALING] = atoi(argv[i + 1]);
    } else if (strcmp(argv[i], "-iScalingMethod") == 0) {
      ifChangeIntParam[I_SCALING_METHOD] = true;
      intParam[I_SCALING_METHOD] = atoi(argv[i + 1]);
    } else if (strcmp(argv[i], "-eLineSearchMethod") == 0) {
      ifChangeIntParam[E_LINE_SEARCH_METHOD] = true;
      intParam[E_LINE_SEARCH_METHOD] = atoi(argv[i + 1]);
    } else if (strcmp(argv[i], "-dScalingLimit") == 0) {
      ifChangeFloatParam[D_SCALING_LIMIT] = true;
      floatParam[D_SCALING_LIMIT] = atof(argv[i + 1]);
    } else if (strcmp(argv[i], "-dPrimalTol") == 0) {
      ifChangeFloatParam[D_PRIMAL_TOL] = true;
      floatParam[D_PRIMAL_TOL] = atof(argv[i + 1]);
    } else if (strcmp(argv[i], "-dDualTol") == 0) {
      ifChangeFloatParam[D_DUAL_TOL] = true;
      floatParam[D_DUAL_TOL] = atof(argv[i + 1]);
    } else if (strcmp(argv[i], "-dGapTol") == 0) {
      ifChangeFloatParam[D_GAP_TOL] = true;
      floatParam[D_GAP_TOL] = atof(argv[i + 1]);
    } else if (strcmp(argv[i], "-dFeasTol") == 0) {
      ifChangeFloatParam[D_FEAS_TOL] = true;
      floatParam[D_FEAS_TOL] = atof(argv[i + 1]);
    } else if (strcmp(argv[i], "-dTimeLim") == 0) {
      ifChangeFloatParam[D_TIME_LIM] = true;
      floatParam[D_TIME_LIM] = atof(argv[i + 1]);
    } else if (strcmp(argv[i], "-eRestartMethod") == 0) {
      ifChangeIntParam[E_RESTART_METHOD] = true;
      intParam[E_RESTART_METHOD] = atoi(argv[i + 1]);
    } else if (strcmp(argv[i], "-ifRuizScaling") == 0) {
      ifChangeIntParam[IF_RUIZ_SCALING] = true;
      intParam[IF_RUIZ_SCALING] = atoi(argv[i + 1]);
    } else if (strcmp(argv[i], "-ifL2Scaling") == 0) {
      ifChangeIntParam[IF_L2_SCALING] = true;
      intParam[IF_L2_SCALING] = atoi(argv[i + 1]);
    } else if (strcmp(argv[i], "-ifPcScaling") == 0) {
      ifChangeIntParam[IF_PC_SCALING] = true;
      intParam[IF_PC_SCALING] = atoi(argv[i + 1]);
    } else if (strcmp(argv[i], "-nLogLevel") == 0) {
      ifChangeIntParam[N_LOG_LEVEL] = true;
      intParam[N_LOG_LEVEL] = atoi(argv[i + 1]);
    } else if (strcmp(argv[i], "-nLogInt") == 0) {
      ifChangeIntParam[N_LOG_INTERVAL] = true;
      intParam[N_LOG_INTERVAL] = atoi(argv[i + 1]);
    } else if (strcmp(argv[i], "-ifPre") == 0) {
      ifChangeIntParam[IF_PRESOLVE] = true;
      intParam[IF_PRESOLVE] = atoi(argv[i + 1]);
    }
  }

  // if (argc>0) {
  //   if (strcmp(argv[argc - 1], "-h") == 0) {
  //     PDHG_PrintUserParamHelper();
      
  //     retcode = RETCODE_FAILED;
  //     goto exit_cleanup;
  //   }
  // }

exit_cleanup:
  return retcode;
}